

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbits.cpp
# Opt level: O2

void testfiles(wins *wins_ar,int ar_len)

{
  int iVar1;
  Am_Drawonable *pAVar2;
  char cVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  Am_Image_Array image_array;
  Am_Image_Array local_40 [8];
  Am_Style image_style;
  
  uVar5 = 0;
  uVar7 = (ulong)(uint)ar_len;
  if (ar_len < 1) {
    uVar7 = uVar5;
  }
  do {
    if (uVar5 == uVar7) {
      return;
    }
    pAVar2 = wins_ar[uVar5].d1;
    iVar9 = 10;
    for (lVar8 = 0; lVar8 != 0x14; lVar8 = lVar8 + 4) {
      pcVar4 = (char *)Am_Merge_Pathname((char *)((long)&_ZZ9testfilesP4winsiE9filenames_rel +
                                                 (long)*(int *)((long)&
                                                  _ZZ9testfilesP4winsiE9filenames_rel + lVar8)));
      Am_Image_Array::Am_Image_Array(&image_array,pcVar4);
      cVar3 = Am_Image_Array::Valid();
      if (cVar3 == '\0') {
        uVar6 = Am_Error("bitmap not found");
        Am_Image_Array::~Am_Image_Array(&image_array);
        _Unwind_Resume(uVar6);
      }
      iVar1 = *(int *)((long)&_ZZ9testfilesP4winsiE10colornames_rel + lVar8);
      Am_Image_Array::Am_Image_Array(local_40,&image_array);
      Am_Style::Am_Style(&image_style,(long)&_ZZ9testfilesP4winsiE10colornames_rel + (long)iVar1,8,1
                         ,0,1,&Am_DEFAULT_DASH_LIST,2,2,0,local_40);
      Am_Image_Array::~Am_Image_Array(local_40);
      (**(code **)(*(long *)pAVar2 + 0x160))(pAVar2,&Am_White,&image_style,iVar9,10,0x28,0x28,0);
      Am_Style::~Am_Style(&image_style);
      Am_Image_Array::~Am_Image_Array(&image_array);
      iVar9 = iVar9 + 0x32;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void
testfiles(wins *wins_ar, int ar_len)
{
  static const char *filenames[5] = {IMFN_GREY, IMFN_HI, IMFN_SMILE, IMFN_FUN,
                                     IMFN_DIAMOND};
  static const char *colornames[5] = {"purple", "green", "blue", "black",
                                      "red"};

  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *d = wins_ar[i].d1;
    for (int n = 0; n < 5; n++) {
      Am_Image_Array image_array(Am_Merge_Pathname(filenames[n]));
      if (!image_array.Valid())
        Am_Error("bitmap not found");
      Am_Style image_style(colornames[n], 8, Am_CAP_BUTT, Am_JOIN_MITER,
                           Am_LINE_ON_OFF_DASH, Am_DEFAULT_DASH_LIST,
                           Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_STIPPLED,
                           Am_FILL_POLY_EVEN_ODD, image_array);
      int left = 10 + 50 * n;
      d->Draw_Rectangle(Am_White, image_style, left, 10, 40, 40);
    }
  }
}